

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateBuildingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  long lVar2;
  
  pFVar1 = this->descriptor_;
  if (*(int *)(pFVar1 + 0x3c) != 3) {
    lVar2 = google::protobuf::FieldDescriptor::message_type();
    if (((lVar2 != 0) || (pFVar1[0x41] != (FieldDescriptor)0x0)) ||
       (*(int *)(*(long *)(pFVar1 + 0x28) + 0x3c) == 2)) {
      google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
    }
  }
  google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  return;
}

Assistant:

void ImmutableStringFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_)) {
    printer->Print(variables_,
                   "if ($get_has_field_bit_from_local$) {\n"
                   "  $set_has_field_bit_to_local$;\n"
                   "}\n");
  }
  printer->Print(variables_, "result.$name$_ = $name$_;\n");
}